

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::SeekHead::AddSeekEntry(SeekHead *this,uint32_t id,uint64_t pos)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 2;
  do {
    lVar2 = lVar1;
    if (lVar2 == 7) goto LAB_0011ebd3;
    lVar1 = lVar2 + 1;
  } while (this->seek_entry_id_[lVar2 + -2] != 0);
  this->seek_entry_id_[lVar2 + -2] = id;
  this->seek_entry_pos_[lVar2 + -2] = pos;
LAB_0011ebd3:
  return lVar2 - 2U < 5;
}

Assistant:

bool SeekHead::AddSeekEntry(uint32_t id, uint64_t pos) {
  for (int32_t i = 0; i < kSeekEntryCount; ++i) {
    if (seek_entry_id_[i] == 0) {
      seek_entry_id_[i] = id;
      seek_entry_pos_[i] = pos;
      return true;
    }
  }
  return false;
}